

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_monitor.cpp
# Opt level: O1

void __thiscall r_exec::SGMonitor::commit(SGMonitor *this)

{
  bool bVar1;
  Goal *this_00;
  uint64_t now;
  _List_node_base *p_Var2;
  double dVar3;
  double dVar4;
  
  this_00 = _Fact::get_goal((_Fact *)(this->super__GMonitor).super_Monitor.target.object);
  now = (*Now)();
  p_Var2 = (this->super__GMonitor).sim_failures.mandatory_solutions.
           super__List_base<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>,_std::allocator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  do {
    if ((SimOutcomes *)p_Var2 == &(this->super__GMonitor).sim_failures) {
      for (p_Var2 = (this->super__GMonitor).sim_failures.optional_solutions.
                    super__List_base<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>,_std::allocator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>_>
                    ._M_impl._M_node.super__List_node_base._M_next;
          p_Var2 != (_List_node_base *)&(this->super__GMonitor).sim_failures.optional_solutions;
          p_Var2 = p_Var2->_M_next) {
        bVar1 = Sim::is_invalidated((Sim *)p_Var2[1]._M_prev);
        if (!bVar1) {
          dVar3 = Goal::get_strength((Goal *)p_Var2[1]._M_next,now);
          dVar4 = Goal::get_strength(this_00,now);
          if (dVar4 < dVar3) {
            Sim::invalidate((Sim *)p_Var2[1]._M_prev);
          }
        }
      }
      return;
    }
    bVar1 = Sim::is_invalidated(*(Sim **)((long)(p_Var2 + 1) + 8));
    if (!bVar1) {
      dVar3 = Goal::get_strength((Goal *)p_Var2[1]._M_next,now);
      dVar4 = Goal::get_strength(this_00,now);
      if (dVar4 < dVar3) {
        Sim::invalidate(*(Sim **)((long)(p_Var2 + 1) + 8));
        return;
      }
    }
    p_Var2 = p_Var2->_M_next;
  } while( true );
}

Assistant:

void SGMonitor::commit()   // the purpose is to invalidate damaging simulations and let the rest flow upward.
{
    Goal *monitored_goal = target->get_goal();
    uint64_t now = Now();
    SolutionList::const_iterator sol;

    for (sol = sim_failures.mandatory_solutions.begin(); sol != sim_failures.mandatory_solutions.end(); ++sol) { // check if any mandatory solution could result in the failure of more important a goal.
        if ((*sol).second->is_invalidated()) {
            continue;
        }

        if ((*sol).first->get_strength(now) > monitored_goal->get_strength(now)) { // cave in.
            (*sol).second->invalidate();
            return;
        }
    }

    for (sol = sim_failures.optional_solutions.begin(); sol != sim_failures.optional_solutions.end(); ++sol) { // check if any optional solutions could result in the failure of more important a goal; invalidate the culprits.
        if ((*sol).second->is_invalidated()) {
            continue;
        }

        if ((*sol).first->get_strength(now) > monitored_goal->get_strength(now)) {
            (*sol).second->invalidate();
        }
    }
}